

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::lru_cache<unsigned_long,unsigned_long,(cappuccino::thread_safe)0>::
find_range_fill<std::unordered_map<unsigned_long,std::optional<unsigned_long>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::optional<unsigned_long>>>>>
          (lru_cache<unsigned_long,unsigned_long,(cappuccino::thread_safe)0> *this,
          unordered_map<unsigned_long,_std::optional<unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::optional<unsigned_long>_>_>_>
          *key_optional_value_range,peek peek)

{
  _Storage<unsigned_long,_true> _Var1;
  bool bVar2;
  reference __in;
  type *key_00;
  _Storage<unsigned_long,_true> *p_Var3;
  optional<unsigned_long> oVar4;
  undefined7 uStack_5f;
  type *optional_value;
  type *key;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::optional<unsigned_long>_>,_false> local_40
  ;
  iterator __end0;
  iterator __begin0;
  unordered_map<unsigned_long,_std::optional<unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::optional<unsigned_long>_>_>_>
  *__range3;
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_> guard;
  peek peek_local;
  unordered_map<unsigned_long,_std::optional<unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::optional<unsigned_long>_>_>_>
  *key_optional_value_range_local;
  lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  guard._M_device._4_4_ = peek;
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_>::lock_guard
            ((lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_> *)&__range3,
             (mutex_type *)this);
  __end0 = std::
           unordered_map<unsigned_long,_std::optional<unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::optional<unsigned_long>_>_>_>
           ::begin(key_optional_value_range);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::optional<unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::optional<unsigned_long>_>_>_>
       ::end(key_optional_value_range);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end0.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_std::optional<unsigned_long>_>,_false>
                       ,&local_40);
    if (!bVar2) break;
    __in = std::__detail::
           _Node_iterator<std::pair<const_unsigned_long,_std::optional<unsigned_long>_>,_false,_false>
           ::operator*(&__end0);
    key_00 = std::get<0ul,unsigned_long_const,std::optional<unsigned_long>>(__in);
    p_Var3 = (_Storage<unsigned_long,_true> *)
             std::get<1ul,unsigned_long_const,std::optional<unsigned_long>>(__in);
    oVar4 = lru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)0>::do_find
                      ((lru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)0> *)this,
                       key_00,guard._M_device._4_4_);
    p_Var3->_M_value =
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    _Var1._M_value._1_7_ = uStack_5f;
    _Var1._M_value._0_1_ =
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    p_Var3[1] = _Var1;
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::optional<unsigned_long>_>,_false,_false>::
    operator++(&__end0);
  }
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_>::~lock_guard
            ((lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_> *)&__range3);
  return;
}

Assistant:

auto find_range_fill(range_type& key_optional_value_range, peek peek = peek::no) -> void
    {
        std::lock_guard guard{m_lock};
        for (auto& [key, optional_value] : key_optional_value_range)
        {
            optional_value = do_find(key, peek);
        }
    }